

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

bool __thiscall slang::SourceManager::isFileLoc(SourceManager *this,SourceLocation location)

{
  bool bVar1;
  BufferID BVar2;
  FileInfo *this_00;
  SourceManager *in_RDI;
  shared_lock<std::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  BufferID in_stack_ffffffffffffffbc;
  BufferID local_20;
  BufferID local_1c [6];
  byte local_1;
  
  local_1c[0] = SourceLocation::buffer
                          ((SourceLocation *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_20 = SourceLocation::buffer
                       ((SourceLocation *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = BufferID::operator==(local_1c,&local_20);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    std::shared_lock<std::shared_mutex>::shared_lock
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    BVar2 = SourceLocation::buffer
                      ((SourceLocation *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    this_00 = getFileInfo<std::shared_lock<std::shared_mutex>_>
                        (in_RDI,in_stack_ffffffffffffffbc,
                         (shared_lock<std::shared_mutex> *)
                         CONCAT44(BVar2.id,in_stack_ffffffffffffffa8));
    local_1 = this_00 != (FileInfo *)0x0;
    std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SourceManager::isFileLoc(SourceLocation location) const {
    if (location.buffer() == SourceLocation::NoLocation.buffer())
        return false;

    std::shared_lock<std::shared_mutex> lock(mutex);
    return getFileInfo(location.buffer(), lock) != nullptr;
}